

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

void * unix_mmap(void *addr,size_t size,size_t try_alignment,int protect_flags,_Bool large_only,
                _Bool allow_large,_Bool *is_large)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  _Bool _Var8;
  long lVar9;
  uint *puVar10;
  int in_ECX;
  size_t in_RDX;
  ulong in_RSI;
  uint in_R8D;
  byte in_R9B;
  undefined1 *in_stack_00000008;
  int lfd;
  int lflags;
  size_t try_ok;
  int flags;
  int fd;
  void *p;
  mi_option_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  ulong size_00;
  void *in_stack_ffffffffffffff98;
  uint local_58;
  uint local_38;
  void *local_30;
  
  uVar1 = in_R8D & 1;
  uVar2 = in_R8D & 1;
  uVar3 = in_R8D & 1;
  uVar4 = in_R8D & 1;
  uVar5 = in_R8D & 1;
  uVar6 = in_R8D & 1;
  local_30 = (void *)0x0;
  size_00 = in_RSI;
  unix_mmap_fd();
  local_38 = 0x22;
  _Var8 = _mi_os_has_overcommit();
  if (_Var8) {
    local_38 = 0x4022;
  }
  sVar7 = unix_mmap::large_page_try_ok;
  if (((in_R9B & 1) != 0) &&
     ((uVar1 != 0 ||
      ((_Var8 = _mi_os_use_large_page
                          (in_stack_ffffffffffffff78,
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
       sVar7 = unix_mmap::large_page_try_ok, _Var8 &&
       (lVar9 = mi_option_get(in_stack_ffffffffffffff6c), sVar7 = unix_mmap::large_page_try_ok,
       lVar9 == 1)))))) {
    if ((uVar2 == 0) && (unix_mmap::large_page_try_ok != 0)) {
      LOCK();
      UNLOCK();
      in_stack_ffffffffffffff74 = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
      sVar7 = unix_mmap::large_page_try_ok - 1;
      in_stack_ffffffffffffff78 = unix_mmap::large_page_try_ok;
    }
    else {
      if (((uVar3 == 0) || ((in_RSI & 0x3fffffff) != 0)) ||
         ((unix_mmap::mi_huge_pages_available & 1U) == 0)) {
        local_58 = local_38 & 0xffffbfff | 0x54040000;
      }
      else {
        local_58 = local_38 & 0xffffbfff | 0x78040000;
      }
      if ((uVar4 != 0) || (sVar7 = unix_mmap::large_page_try_ok, local_58 != local_38)) {
        *in_stack_00000008 = 1;
        local_30 = unix_mmap_prim_aligned
                             (in_stack_ffffffffffffff98,size_00,in_RDX,in_ECX,in_R8D,
                              (int)(in_stack_ffffffffffffff78 >> 0x20));
        if ((local_30 == (void *)0x0) && ((local_58 & 0x78000000) == 0x78000000)) {
          unix_mmap::mi_huge_pages_available = false;
          if (uVar5 != 0) {
            puVar10 = (uint *)__errno_location();
            _mi_warning_message("unable to allocate huge (1GiB) page, trying large (2MiB) pages instead (errno: %i)\n"
                                ,(ulong)*puVar10);
          }
          local_30 = unix_mmap_prim_aligned
                               (in_stack_ffffffffffffff98,size_00,in_RDX,in_ECX,in_R8D,
                                (int)(in_stack_ffffffffffffff78 >> 0x20));
        }
        if (uVar6 != 0) {
          return local_30;
        }
        sVar7 = unix_mmap::large_page_try_ok;
        if (local_30 == (void *)0x0) {
          in_stack_ffffffffffffff98 = (void *)0x8;
          unix_mmap::large_page_try_ok = 8;
          sVar7 = unix_mmap::large_page_try_ok;
        }
      }
    }
  }
  unix_mmap::large_page_try_ok = sVar7;
  if (local_30 == (void *)0x0) {
    *in_stack_00000008 = 0;
    local_30 = unix_mmap_prim_aligned
                         (in_stack_ffffffffffffff98,size_00,in_RDX,in_ECX,in_R8D,
                          (int)(in_stack_ffffffffffffff78 >> 0x20));
    if (((local_30 != (void *)0x0) && ((in_R9B & 1) != 0)) &&
       (_Var8 = _mi_os_use_large_page
                          (in_stack_ffffffffffffff78,
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)), _Var8)) {
      unix_madvise((void *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff74);
    }
  }
  return local_30;
}

Assistant:

static void* unix_mmap(void* addr, size_t size, size_t try_alignment, int protect_flags, bool large_only, bool allow_large, bool* is_large) {
  #if !defined(MAP_ANONYMOUS)
  #define MAP_ANONYMOUS  MAP_ANON
  #endif
  #if !defined(MAP_NORESERVE)
  #define MAP_NORESERVE  0
  #endif
  void* p = NULL;
  const int fd = unix_mmap_fd();
  int flags = MAP_PRIVATE | MAP_ANONYMOUS;
  if (_mi_os_has_overcommit()) {
    flags |= MAP_NORESERVE;
  }
  #if defined(PROT_MAX)
  protect_flags |= PROT_MAX(PROT_READ | PROT_WRITE); // BSD
  #endif
  // huge page allocation
  if (allow_large && (large_only || (_mi_os_use_large_page(size, try_alignment) && mi_option_get(mi_option_allow_large_os_pages) == 1))) {
    static _Atomic(size_t) large_page_try_ok; // = 0;
    size_t try_ok = mi_atomic_load_acquire(&large_page_try_ok);
    if (!large_only && try_ok > 0) {
      // If the OS is not configured for large OS pages, or the user does not have
      // enough permission, the `mmap` will always fail (but it might also fail for other reasons).
      // Therefore, once a large page allocation failed, we don't try again for `large_page_try_ok` times
      // to avoid too many failing calls to mmap.
      mi_atomic_cas_strong_acq_rel(&large_page_try_ok, &try_ok, try_ok - 1);
    }
    else {
      int lflags = flags & ~MAP_NORESERVE;  // using NORESERVE on huge pages seems to fail on Linux
      int lfd = fd;
      #ifdef MAP_ALIGNED_SUPER
      lflags |= MAP_ALIGNED_SUPER;
      #endif
      #ifdef MAP_HUGETLB
      lflags |= MAP_HUGETLB;
      #endif
      #ifdef MAP_HUGE_1GB
      static bool mi_huge_pages_available = true;
      if (large_only && (size % MI_GiB) == 0 && mi_huge_pages_available) {
        lflags |= MAP_HUGE_1GB;
      }
      else
      #endif
      {
        #ifdef MAP_HUGE_2MB
        lflags |= MAP_HUGE_2MB;
        #endif
      }
      #ifdef VM_FLAGS_SUPERPAGE_SIZE_2MB
      lfd |= VM_FLAGS_SUPERPAGE_SIZE_2MB;
      #endif
      if (large_only || lflags != flags) {
        // try large OS page allocation
        *is_large = true;
        p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, lflags, lfd);
        #ifdef MAP_HUGE_1GB
        if (p == NULL && (lflags & MAP_HUGE_1GB) == MAP_HUGE_1GB) {
          mi_huge_pages_available = false; // don't try huge 1GiB pages again
          if (large_only) {
            _mi_warning_message("unable to allocate huge (1GiB) page, trying large (2MiB) pages instead (errno: %i)\n", errno);
          }
          lflags = ((lflags & ~MAP_HUGE_1GB) | MAP_HUGE_2MB);
          p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, lflags, lfd);
        }
        #endif
        if (large_only) return p;
        if (p == NULL) {
          mi_atomic_store_release(&large_page_try_ok, (size_t)8);  // on error, don't try again for the next N allocations
        }
      }
    }
  }
  // regular allocation
  if (p == NULL) {
    *is_large = false;
    p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, flags, fd);
    if (p != NULL) {
      #if defined(MADV_HUGEPAGE)
      // Many Linux systems don't allow MAP_HUGETLB but they support instead
      // transparent huge pages (THP). Generally, it is not required to call `madvise` with MADV_HUGE
      // though since properly aligned allocations will already use large pages if available
      // in that case -- in particular for our large regions (in `memory.c`).
      // However, some systems only allow THP if called with explicit `madvise`, so
      // when large OS pages are enabled for mimalloc, we call `madvise` anyways.
      if (allow_large && _mi_os_use_large_page(size, try_alignment)) {
        if (unix_madvise(p, size, MADV_HUGEPAGE) == 0) {
          // *is_large = true; // possibly
        };
      }
      #elif defined(__sun)
      if (allow_large && _mi_os_use_large_page(size, try_alignment)) {
        struct memcntl_mha cmd = {0};
        cmd.mha_pagesize = _mi_os_large_page_size();
        cmd.mha_cmd = MHA_MAPSIZE_VA;
        if (memcntl((caddr_t)p, size, MC_HAT_ADVISE, (caddr_t)&cmd, 0, 0) == 0) {
          // *is_large = true; // possibly
        }
      }
      #endif
    }
  }
  return p;
}